

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void fejer1_set(int n,double *xtab,double *weight)

{
  ostream *poVar1;
  double *weight_local;
  double *xtab_local;
  int n_local;
  
  if (n == 1) {
    *xtab = 0.0;
    *weight = 2.0;
  }
  else if (n == 2) {
    *xtab = -0.7071067811865475;
    xtab[1] = 0.7071067811865475;
    *weight = 1.0;
    weight[1] = 1.0;
  }
  else if (n == 3) {
    *xtab = -0.8660254037844387;
    xtab[1] = 0.0;
    xtab[2] = 0.8660254037844387;
    *weight = 0.4444444444444444;
    weight[1] = 1.111111111111111;
    weight[2] = 0.4444444444444444;
  }
  else if (n == 4) {
    *xtab = -0.9238795325112867;
    xtab[1] = -0.3826834323650897;
    xtab[2] = 0.3826834323650898;
    xtab[3] = 0.9238795325112867;
    *weight = 0.2642977396044841;
    weight[1] = 0.7357022603955158;
    weight[2] = 0.7357022603955158;
    weight[3] = 0.2642977396044841;
  }
  else if (n == 5) {
    *xtab = -0.9510565162951535;
    xtab[1] = -0.587785252292473;
    xtab[2] = 0.0;
    xtab[3] = 0.5877852522924731;
    xtab[4] = 0.9510565162951535;
    *weight = 0.1677812284666835;
    weight[1] = 0.5255521048666498;
    weight[2] = 0.6133333333333333;
    weight[3] = 0.5255521048666498;
    weight[4] = 0.1677812284666835;
  }
  else if (n == 6) {
    *xtab = -0.9659258262890682;
    xtab[1] = -0.7071067811865475;
    xtab[2] = -0.2588190451025206;
    xtab[3] = 0.2588190451025207;
    xtab[4] = 0.7071067811865476;
    xtab[5] = 0.9659258262890683;
    *weight = 0.1186610213812358;
    weight[1] = 0.3777777777777778;
    weight[2] = 0.5035612008409863;
    weight[3] = 0.5035612008409863;
    weight[4] = 0.3777777777777778;
    weight[5] = 0.1186610213812358;
  }
  else if (n == 7) {
    *xtab = -0.9749279121818237;
    xtab[1] = -0.7818314824680295;
    xtab[2] = -0.4338837391175581;
    xtab[3] = 0.0;
    xtab[4] = 0.4338837391175582;
    xtab[5] = 0.7818314824680298;
    xtab[6] = 0.9749279121818236;
    *weight = 0.08671618072672234;
    weight[1] = 0.2878313947886919;
    weight[2] = 0.3982415401308441;
    weight[3] = 0.454421768707483;
    weight[4] = 0.3982415401308441;
    weight[5] = 0.2878313947886919;
    weight[6] = 0.08671618072672234;
  }
  else if (n == 8) {
    *xtab = -0.9807852804032304;
    xtab[1] = -0.8314696123025453;
    xtab[2] = -0.555570233019602;
    xtab[3] = -0.1950903220161282;
    xtab[4] = 0.1950903220161283;
    xtab[5] = 0.5555702330196023;
    xtab[6] = 0.8314696123025452;
    xtab[7] = 0.9807852804032304;
    *weight = 0.06698294569858981;
    weight[1] = 0.2229879330145788;
    weight[2] = 0.3241525190645244;
    weight[3] = 0.3858766022223071;
    weight[4] = 0.3858766022223071;
    weight[5] = 0.3241525190645244;
    weight[6] = 0.2229879330145788;
    weight[7] = 0.06698294569858981;
  }
  else if (n == 9) {
    *xtab = -0.984807753012208;
    xtab[1] = -0.8660254037844385;
    xtab[2] = -0.6427876096865394;
    xtab[3] = -0.3420201433256685;
    xtab[4] = 0.0;
    xtab[5] = 0.3420201433256688;
    xtab[6] = 0.6427876096865394;
    xtab[7] = 0.8660254037844387;
    xtab[8] = 0.984807753012208;
    *weight = 0.05273664990990676;
    weight[1] = 0.1791887125220458;
    weight[2] = 0.2640372225410044;
    weight[3] = 0.3308451751681364;
    weight[4] = 0.346384479717813;
    weight[5] = 0.3308451751681364;
    weight[6] = 0.2640372225410044;
    weight[7] = 0.1791887125220458;
    weight[8] = 0.05273664990990676;
  }
  else {
    if (n != 10) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"FEJER1_SET - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
      std::operator<<(poVar1,"\n");
      std::operator<<((ostream *)&std::cerr,"  Legal values are 1 through 10.\n");
      exit(1);
    }
    *xtab = -0.9876883405951377;
    xtab[1] = -0.8910065241883678;
    xtab[2] = -0.7071067811865475;
    xtab[3] = -0.4539904997395467;
    xtab[4] = -0.1564344650402306;
    xtab[5] = 0.1564344650402309;
    xtab[6] = 0.4539904997395468;
    xtab[7] = 0.7071067811865476;
    xtab[8] = 0.8910065241883679;
    xtab[9] = 0.9876883405951378;
    *weight = 0.04293911957413078;
    weight[1] = 0.1458749193773909;
    weight[2] = 0.2203174603174603;
    weight[3] = 0.2808792186638755;
    weight[4] = 0.3099892820671425;
    weight[5] = 0.3099892820671425;
    weight[6] = 0.2808792186638755;
    weight[7] = 0.2203174603174603;
    weight[8] = 0.1458749193773909;
    weight[9] = 0.04293911957413078;
  }
  return;
}

Assistant:

void fejer1_set ( int n, double xtab[], double weight[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER1_SET sets abscissas and weights for Fejer type 1 quadrature.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 March 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.  N should be
//    between 1 and 10.
//
//    Output, double XTAB[N], the abscissas.
//
//    Output, double WEIGHT[N], the weights.
//
{
  if ( n == 1 )
  {
    xtab[0]   =  0.000000000000000;
    weight[0] =  2.000000000000000;
  }
  else if ( n == 2 )
  {
    xtab[0] =   -0.7071067811865475;
    xtab[1] =    0.7071067811865475;

    weight[0] =  1.000000000000000;
    weight[1] =  1.000000000000000;
  }
  else if ( n == 3 )
  {
    xtab[0] =  -0.8660254037844387;
    xtab[1] =   0.0000000000000000;
    xtab[2] =   0.8660254037844387;

    weight[0] =  0.4444444444444444;
    weight[1] =  1.111111111111111;
    weight[2] =  0.4444444444444444;
  }                  
  else if ( n == 4 )
  {
    xtab[0] =  -0.9238795325112867;
    xtab[1] =  -0.3826834323650897;
    xtab[2] =   0.3826834323650898;
    xtab[3] =   0.9238795325112867;

    weight[0] = 0.2642977396044841;
    weight[1] = 0.7357022603955158;
    weight[2] = 0.7357022603955158;
    weight[3] = 0.2642977396044841;
  }
  else if ( n == 5 )
  {
    xtab[0] =  -0.9510565162951535;
    xtab[1] =  -0.5877852522924730;
    xtab[2] =   0.0000000000000000;
    xtab[3] =   0.5877852522924731;
    xtab[4] =   0.9510565162951535;  

    weight[0] = 0.1677812284666835;
    weight[1] = 0.5255521048666498;
    weight[2] = 0.6133333333333333;
    weight[3] = 0.5255521048666498;
    weight[4] = 0.1677812284666835;
  }
  else if ( n == 6 )
  {
    xtab[0] =  -0.9659258262890682;
    xtab[1] =  -0.7071067811865475;
    xtab[2] =  -0.2588190451025206;
    xtab[3] =   0.2588190451025207;
    xtab[4] =   0.7071067811865476;
    xtab[5] =   0.9659258262890683;
      
    weight[0] = 0.1186610213812358;
    weight[1] = 0.3777777777777778;
    weight[2] = 0.5035612008409863;
    weight[3] = 0.5035612008409863;
    weight[4] = 0.3777777777777778;
    weight[5] = 0.1186610213812358;
  }
  else if ( n == 7 )
  {
    xtab[0] =  -0.9749279121818237;
    xtab[1] =  -0.7818314824680295;
    xtab[2] =  -0.4338837391175581;
    xtab[3] =   0.0000000000000000;
    xtab[4] =   0.4338837391175582;
    xtab[5] =   0.7818314824680298;
    xtab[6] =   0.9749279121818236;    
                    
    weight[0] = 0.08671618072672234;
    weight[1] = 0.2878313947886919;
    weight[2] = 0.3982415401308441;
    weight[3] = 0.4544217687074830;
    weight[4] = 0.3982415401308441;
    weight[5] = 0.2878313947886919;
    weight[6] = 0.08671618072672234;
  }
  else if ( n == 8 )
  {
    xtab[0] =  -0.9807852804032304;
    xtab[1] =  -0.8314696123025453;
    xtab[2] =  -0.5555702330196020;
    xtab[3] =  -0.1950903220161282;
    xtab[4] =   0.1950903220161283;
    xtab[5] =   0.5555702330196023;
    xtab[6] =   0.8314696123025452;
    xtab[7] =   0.9807852804032304;
                        
    weight[0] = 0.06698294569858981;
    weight[1] = 0.2229879330145788;
    weight[2] = 0.3241525190645244;
    weight[3] = 0.3858766022223071;
    weight[4] = 0.3858766022223071;
    weight[5] = 0.3241525190645244;
    weight[6] = 0.2229879330145788;
    weight[7] = 0.06698294569858981;
 }
 else if ( n == 9 )
 {
    xtab[0] =  -0.9848077530122080;
    xtab[1] =  -0.8660254037844385;
    xtab[2] =  -0.6427876096865394;
    xtab[3] =  -0.3420201433256685;
    xtab[4] =   0.0000000000000000;
    xtab[5] =   0.3420201433256688;
    xtab[6] =   0.6427876096865394;
    xtab[7] =   0.8660254037844387;
    xtab[8] =   0.9848077530122080;
                       
    weight[0] = 0.05273664990990676;
    weight[1] = 0.1791887125220458;
    weight[2] = 0.2640372225410044;
    weight[3] = 0.3308451751681364;
    weight[4] = 0.3463844797178130;
    weight[5] = 0.3308451751681364;
    weight[6] = 0.2640372225410044;
    weight[7] = 0.1791887125220458;
    weight[8] = 0.05273664990990676;
  }
  else if ( n == 10 )
  {
    xtab[0] =  -0.9876883405951377;
    xtab[1] =  -0.8910065241883678;
    xtab[2] =  -0.7071067811865475;
    xtab[3] =  -0.4539904997395467;
    xtab[4] =  -0.1564344650402306;
    xtab[5] =   0.1564344650402309;
    xtab[6] =   0.4539904997395468;
    xtab[7] =   0.7071067811865476;
    xtab[8] =   0.8910065241883679;
    xtab[9] =   0.9876883405951378;
  
    weight[0] = 0.04293911957413078;
    weight[1] = 0.1458749193773909; 
    weight[2] = 0.2203174603174603;
    weight[3] = 0.2808792186638755;
    weight[4] = 0.3099892820671425;
    weight[5] = 0.3099892820671425;
    weight[6] = 0.2808792186638755;
    weight[7] = 0.2203174603174603;
    weight[8] = 0.1458749193773909;
    weight[9] = 0.04293911957413078;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "FEJER1_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 through 10.\n";
    exit ( 1 );
  }

  return;
}